

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_eng.c
# Opt level: O0

int gost_pkey_meths(ENGINE *e,EVP_PKEY_METHOD **pmeth,int **nids,int nid)

{
  int in_ECX;
  int **in_RDX;
  undefined8 *in_RSI;
  gost_meth_minfo *info;
  gost_meth_minfo *local_30;
  int local_4;
  
  if (in_RSI == (undefined8 *)0x0) {
    local_4 = gost_meth_nids(in_RDX);
  }
  else {
    for (local_30 = gost_meth_array; local_30->nid != 0; local_30 = local_30 + 1) {
      if (in_ECX == local_30->nid) {
        *in_RSI = *local_30->pmeth;
        return 1;
      }
    }
    *in_RSI = 0;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int gost_pkey_meths(ENGINE *e, EVP_PKEY_METHOD **pmeth,
                           const int **nids, int nid)
{
    struct gost_meth_minfo *info;

    if (!pmeth)
        return gost_meth_nids(nids);

    for (info = gost_meth_array; info->nid; info++)
        if (nid == info->nid) {
            *pmeth = *info->pmeth;
            return 1;
        }
    *pmeth = NULL;
    return 0;
}